

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::anon_unknown_0::FullErrorString
                   (string *__return_storage_ptr__,string *name,int line_num,string *msg)

{
  AlphaNum *a;
  allocator local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  AlphaNum local_58;
  
  std::__cxx11::string::string((string *)&local_78,"error: ",&local_119);
  std::operator+(&local_f8,&local_78,name);
  std::operator+(&local_d8,&local_f8," Line ");
  strings::AlphaNum::AlphaNum(&local_58,line_num);
  StrCat_abi_cxx11_(&local_118,(protobuf *)&local_58,a);
  std::operator+(&local_b8,&local_d8,&local_118);
  std::operator+(&local_98,&local_b8,", ");
  std::operator+(__return_storage_ptr__,&local_98,msg);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string FullErrorString(const std::string& name, int line_num, const std::string& msg) {
  return std::string("error: ") + name + " Line " + StrCat(line_num) + ", " + msg;
}